

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock.h
# Opt level: O0

void rwlock_rlock(rwlock *lock)

{
  rwlock *lock_local;
  
  while( true ) {
    do {
    } while (lock->write != 0);
    LOCK();
    lock->read = lock->read + 1;
    UNLOCK();
    if (lock->write == 0) break;
    LOCK();
    lock->read = lock->read + -1;
    UNLOCK();
  }
  return;
}

Assistant:

static inline void
rwlock_rlock(struct rwlock *lock) {
	for (;;) {
		while(lock->write) {
			__sync_synchronize();
		}
		__sync_add_and_fetch(&lock->read,1);
		if (lock->write) {
			__sync_sub_and_fetch(&lock->read,1);
		} else {
			break;
		}
	}
}